

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_defaults_add_unres
              (lyd_node **root,int options,ly_ctx *ctx,lys_module **modules,int mod_count,
              lyd_node *data_tree,lyd_node *act_notif,unres_data *unres,int wd)

{
  LYS_NODE LVar1;
  lys_module *plVar2;
  int iVar3;
  lyd_node *plVar4;
  ly_set *set;
  char *format;
  lys_node *plVar5;
  ly_ctx *plVar6;
  uint uVar7;
  lyd_node *plVar8;
  undefined8 uVar9;
  lyd_node *node2;
  lyd_node **root_00;
  ly_ctx *unaff_R15;
  bool bVar10;
  lys_node *local_58;
  ly_ctx *local_38;
  
  if (root == (lyd_node **)0x0) {
LAB_001701c4:
    __assert_fail("root && (*root || ctx) && unres && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1dd8,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                 );
  }
  plVar4 = *root;
  if (((((uint)options >> 8 & 1) != 0) || (unres == (unres_data *)0x0)) ||
     (ctx == (ly_ctx *)0x0 && plVar4 == (lyd_node *)0x0)) goto LAB_001701c4;
  if (ctx == (ly_ctx *)0x0) {
    ctx = plVar4->schema->module->ctx;
  }
  if (plVar4 == (lyd_node *)0x0 && ((uint)options >> 0xc & 1) != 0) {
    format = "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.";
    goto LAB_0016fabd;
  }
  if ((options & 0x70U) == 0) {
    if ((plVar4 != (lyd_node *)0x0) && (plVar4->parent != (lyd_node *)0x0)) {
      options = options | 0x1000;
    }
    local_58 = (lys_node *)0x0;
  }
  else {
    if (plVar4 == (lyd_node *)0x0) {
      format = 
      "Cannot add default values to RPC, RPC reply, and notification without at least the empty container."
      ;
      goto LAB_0016fabd;
    }
    if ((act_notif == (lyd_node *)0x0 && (options & 0x10U) != 0) &&
       (plVar4->schema->nodetype != LYS_RPC)) {
      format = "Not valid RPC/action data.";
      goto LAB_0016fabd;
    }
    if (((options & 0x20U) != 0 && act_notif == (lyd_node *)0x0) &&
       (plVar4->schema->nodetype != LYS_RPC)) {
      format = "Not valid reply data.";
      goto LAB_0016fabd;
    }
    if (((options & 0x40U) != 0 && act_notif == (lyd_node *)0x0) &&
       (plVar4->schema->nodetype != LYS_NOTIF)) {
      format = "Not valid notification data.";
      goto LAB_0016fabd;
    }
    if (act_notif != (lyd_node *)0x0) {
      plVar4 = act_notif;
    }
    local_58 = plVar4->schema;
  }
  if (wd != 0) {
    root_00 = &act_notif;
    if (act_notif == (lyd_node *)0x0) {
      root_00 = root;
    }
    if (((uint)options >> 8 & 1) != 0) {
      __assert_fail("root && !(options & LYD_OPT_ACT_NOTIF)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1d7c,
                    "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                   );
    }
    plVar4 = *root_00;
    if (ctx == (ly_ctx *)0x0 && plVar4 == (lyd_node *)0x0) {
      __assert_fail("*root || ctx",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1d7d,
                    "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                   );
    }
    if (((uint)options >> 0xc & 1) != 0 && plVar4 == (lyd_node *)0x0) {
      __assert_fail("!(options & LYD_OPT_NOSIBLINGS) || *root",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1d7e,
                    "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                   );
    }
    if ((options & 0xeU) == 0) {
      plVar6 = ctx;
      if (ctx == (ly_ctx *)0x0) {
        plVar6 = plVar4->schema->module->ctx;
      }
      if ((options & 0x10000f1U) == 0 || (options & 1U) != 0) {
        if (((uint)options >> 0xc & 1) == 0) {
          if (modules == (lys_module **)0x0 || mod_count == 0) {
            local_38 = plVar6;
            if (0 < (plVar6->models).used) {
              unaff_R15 = (ly_ctx *)0x0;
              do {
                plVar2 = (plVar6->models).list[(long)unaff_R15];
                if ((*(ushort *)&plVar2->field_0x40 & 0xc0) == 0x80) {
                  for (plVar5 = plVar2->data; plVar5 != (lys_node *)0x0; plVar5 = plVar5->next) {
                    if (((plVar5->nodetype & 0x903f) != LYS_UNKNOWN) &&
                       (iVar3 = lyd_wd_add_subtree(root_00,(lyd_node *)0x0,(lyd_node *)0x0,plVar5,1,
                                                   options,unres), iVar3 != 0)) {
                      return 1;
                    }
                  }
                }
                unaff_R15 = (ly_ctx *)((long)&(unaff_R15->dict).hash_tab + 1);
              } while ((long)unaff_R15 < (long)(plVar6->models).used);
            }
          }
          else if (0 < mod_count) {
            local_38 = (ly_ctx *)0x0;
            do {
              for (plVar5 = modules[(long)local_38]->data; plVar5 != (lys_node *)0x0;
                  plVar5 = plVar5->next) {
                if (((plVar5->nodetype & 0x903f) != LYS_UNKNOWN) &&
                   (iVar3 = lyd_wd_add_subtree(root_00,(lyd_node *)0x0,(lyd_node *)0x0,plVar5,1,
                                               options,unres), iVar3 != 0)) {
                  return 1;
                }
              }
              local_38 = (ly_ctx *)((long)&(local_38->dict).hash_tab + 1);
            } while (local_38 != (ly_ctx *)(ulong)(uint)mod_count);
            unaff_R15 = (ly_ctx *)0x0;
          }
          goto LAB_0016fbf7;
        }
LAB_0016ff87:
        iVar3 = lyd_wd_add_subtree(root_00,(lyd_node *)0x0,(lyd_node *)0x0,plVar4->schema,1,options,
                                   unres);
      }
      else {
        if ((options & 0x40U) == 0) {
          if ((options & 0x30U) == 0) {
            if (((uint)options >> 0x18 & 1) == 0) {
              uVar9 = 0x1dc7;
              goto LAB_0016fcf1;
            }
            goto LAB_0016ff87;
          }
          if ((plVar4 == (lyd_node *)0x0) ||
             ((plVar4->schema->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN)) {
            format = "Subtree is not a single RPC/action/reply.";
            ctx = plVar6;
            goto LAB_0016fabd;
          }
          plVar5 = plVar4->schema->child;
          if ((options & 0x10U) == 0) {
            for (; plVar5 != (lys_node *)0x0; plVar5 = plVar5->next) {
              if (plVar5->nodetype == LYS_OUTPUT) goto LAB_00170171;
            }
          }
          else {
            for (; plVar5 != (lys_node *)0x0; plVar5 = plVar5->next) {
              if (plVar5->nodetype == LYS_INPUT) goto LAB_00170171;
            }
          }
          plVar5 = (lys_node *)0x0;
LAB_00170171:
          if (plVar5 == (lys_node *)0x0) goto LAB_0016fbf7;
        }
        else if ((plVar4 == (lyd_node *)0x0) ||
                (plVar5 = plVar4->schema, plVar5->nodetype != LYS_NOTIF)) {
          format = "Subtree is not a single notification.";
          ctx = plVar6;
LAB_0016fabd:
          ly_log(ctx,LY_LLERR,LY_EINVAL,format);
          return 1;
        }
        iVar3 = lyd_wd_add_subtree(root_00,plVar4,plVar4,plVar5,0,options,unres);
      }
      if (iVar3 != 0) {
        return 1;
      }
    }
  }
LAB_0016fbf7:
  if (unres->count == 0) {
    return 0;
  }
  plVar4 = *root;
  if (plVar4 == (lyd_node *)0x0) {
    uVar9 = 0x1e06;
    plVar6 = ctx;
LAB_0016fcf1:
    ly_log(plVar6,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
           ,uVar9);
    return 1;
  }
  bVar10 = (options & 0x70U) != 0;
  if (bVar10 && data_tree != (lyd_node *)0x0) {
    if (act_notif == (lyd_node *)0x0) {
      node2 = (lyd_node *)0x0;
      unaff_R15 = (ly_ctx *)0x0;
      local_38 = (ly_ctx *)data_tree;
    }
    else {
      if (data_tree == (lyd_node *)0x0) {
        node2 = (lyd_node *)0x0;
        plVar6 = (ly_ctx *)0x0;
        unaff_R15 = (ly_ctx *)0x0;
      }
      else {
        local_38 = (ly_ctx *)0x0;
        plVar8 = (lyd_node *)0x0;
        unaff_R15 = (ly_ctx *)data_tree;
        node2 = plVar4;
LAB_0016fd30:
        do {
          if (((lys_node *)(unaff_R15->dict).hash_tab == node2->schema) &&
             ((node2->schema->nodetype != LYS_LIST ||
              (iVar3 = lyd_list_equal((lyd_node *)unaff_R15,node2,0), iVar3 != 0)))) {
            plVar4 = node2->child;
            if (plVar4 == (lyd_node *)0x0) {
              __assert_fail("msg_sibling->child",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                            ,0x1e27,
                            "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                           );
            }
            plVar6 = (ly_ctx *)(unaff_R15->models).list;
            while (LVar1 = plVar4->schema->nodetype, LVar1 == LYS_LEAF) {
              plVar4 = plVar4->next;
              if (plVar4 == (lyd_node *)0x0) {
                __assert_fail("msg_sibling->next",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e2b,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
            }
            plVar8 = node2;
            local_38 = unaff_R15;
            if ((LVar1 & (LYS_ACTION|LYS_NOTIF)) != LYS_UNKNOWN) {
              if (act_notif->parent == (lyd_node *)0x0) {
                __assert_fail("act_notif->parent",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e2f,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
              if (act_notif->parent->schema != (lys_node *)(unaff_R15->dict).hash_tab) {
                __assert_fail("act_notif->parent->schema == data_tree_parent->schema",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e30,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
              if (plVar4 != act_notif) {
                __assert_fail("msg_sibling == act_notif",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e31,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
              goto LAB_0016ffdb;
            }
          }
          else {
            unaff_R15 = *(ly_ctx **)((long)&(unaff_R15->dict).lock + 0x10);
            if (unaff_R15 != (ly_ctx *)0x0) goto LAB_0016fd30;
            plVar6 = (ly_ctx *)0x0;
            plVar4 = node2;
          }
          unaff_R15 = plVar6;
          node2 = plVar4;
        } while (plVar6 != (ly_ctx *)0x0);
        plVar6 = (ly_ctx *)0x0;
        node2 = plVar8;
        unaff_R15 = local_38;
      }
LAB_0016ffdb:
      local_38 = plVar6;
      if (unaff_R15 == (ly_ctx *)0x0) {
        local_38 = (ly_ctx *)data_tree;
      }
    }
    lyd_unlink_internal(plVar4,0);
    if (unaff_R15 == (ly_ctx *)0x0 && local_38 == (ly_ctx *)0x0) {
      __assert_fail("data_tree_parent || data_tree_sibling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1e46,
                    "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                   );
    }
    if (unaff_R15 == (ly_ctx *)0x0) {
      if ((local_38->dict).lock.__data.__list.__next != (__pthread_internal_list *)0x0) {
        __assert_fail("!data_tree_sibling->parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e4c,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
      unaff_R15 = (ly_ctx *)0x0;
      iVar3 = lyd_insert_nextto((lyd_node *)(local_38->dict).lock.__data.__list.__prev,plVar4,0,0);
    }
    else {
      iVar3 = lyd_insert_common((lyd_node *)unaff_R15,(lyd_node **)0x0,plVar4,0);
    }
    uVar7 = 1;
    if (iVar3 != 0) goto LAB_0017013e;
  }
  else {
    plVar4 = (lyd_node *)0x0;
    node2 = (lyd_node *)0x0;
  }
  iVar3 = resolve_unres_data(ctx,unres,root,options);
  uVar7 = (uint)(iVar3 != 0);
  if (((options & 0x70U) != 0) && (iVar3 == 0)) {
    if (data_tree == (lyd_node *)0x0) {
      if (*root == (lyd_node *)0x0) {
        set = (ly_set *)0x0;
      }
      else {
        set = lyd_find_instance(*root,local_58);
        if ((set == (ly_set *)0x0) || (1 < set->number)) {
          __assert_fail("set && ((set->number == 0) || (set->number == 1))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1e62,
                        "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                       );
        }
      }
    }
    else {
      if (unaff_R15 != (ly_ctx *)0x0) {
        local_38 = unaff_R15;
      }
      set = lyd_find_instance((lyd_node *)local_38,local_58);
      if ((set == (ly_set *)0x0) || (1 < set->number)) {
        __assert_fail("set && ((set->number == 0) || (set->number == 1))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e5f,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
    }
    if ((set == (ly_set *)0x0) || (uVar7 = 0, set->number == 0)) {
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_LYS,local_58,
              "Operation/notification not supported because of the current configuration.");
      uVar7 = 1;
    }
    ly_set_free(set);
  }
LAB_0017013e:
  if (!bVar10 || data_tree == (lyd_node *)0x0) {
    return uVar7;
  }
  lyd_unlink_internal(plVar4,0);
  if (node2 != (lyd_node *)0x0) {
    lyd_insert_common(node2,(lyd_node **)0x0,plVar4,0);
    return uVar7;
  }
  return uVar7;
}

Assistant:

int
lyd_defaults_add_unres(struct lyd_node **root, int options, struct ly_ctx *ctx, const struct lys_module **modules,
                       int mod_count, const struct lyd_node *data_tree, struct lyd_node *act_notif,
                       struct unres_data *unres, int wd)
{
    struct lyd_node *msg_sibling = NULL, *msg_parent = NULL, *data_tree_sibling, *data_tree_parent;
    struct lys_node *msg_op = NULL;
    struct ly_set *set;
    int ret = EXIT_FAILURE;

    assert(root && (*root || ctx) && unres && !(options & LYD_OPT_ACT_NOTIF));

    if (!ctx) {
        ctx = (*root)->schema->module->ctx;
    }

    if ((options & LYD_OPT_NOSIBLINGS) && !(*root)) {
        LOGERR(ctx, LY_EINVAL, "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
        return EXIT_FAILURE;
    }

    if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        if (!(*root)) {
            LOGERR(ctx, LY_EINVAL, "Cannot add default values to RPC, RPC reply, and notification without at least the empty container.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPC) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(ctx, LY_EINVAL, "Not valid RPC/action data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPCREPLY) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(ctx, LY_EINVAL, "Not valid reply data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_NOTIF) && !act_notif && ((*root)->schema->nodetype != LYS_NOTIF)) {
            LOGERR(ctx, LY_EINVAL, "Not valid notification data.");
            return EXIT_FAILURE;
        }

        /* remember the operation/notification schema */
        msg_op = act_notif ? act_notif->schema : (*root)->schema;
    } else if (*root && (*root)->parent) {
        /* we have inner node, so it will be considered as
         * a root of subtree where to add default nodes and
         * no of its siblings will be affected */
        options |= LYD_OPT_NOSIBLINGS;
    }

    /* add missing default nodes */
    if (wd && lyd_wd_add((act_notif ? &act_notif : root), ctx, modules, mod_count, unres, options)) {
        return EXIT_FAILURE;
    }

    /* check leafrefs and/or instids if any */
    if (unres && unres->count) {
        if (!(*root)) {
            LOGINT(ctx);
            return EXIT_FAILURE;
        }

        /* temporarily link the additional data tree to the RPC/action/notification */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* duplicate the message tree - if it gets deleted we would not be able to positively identify it */
            msg_parent = NULL;
            msg_sibling = *root;

            if (act_notif) {
                /* fun case */
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
                while (data_tree_sibling) {
                    while (data_tree_sibling) {
                        if ((data_tree_sibling->schema == msg_sibling->schema)
                                && ((msg_sibling->schema->nodetype != LYS_LIST)
                                    || lyd_list_equal(data_tree_sibling, msg_sibling, 0))) {
                            /* match */
                            break;
                        }

                        data_tree_sibling = data_tree_sibling->next;
                    }

                    if (data_tree_sibling) {
                        /* prepare for the new data_tree iteration */
                        data_tree_parent = data_tree_sibling;
                        data_tree_sibling = data_tree_sibling->child;

                        /* find new action sibling to search for later (skip list keys) */
                        msg_parent = msg_sibling;
                        assert(msg_sibling->child);
                        for (msg_sibling = msg_sibling->child;
                                msg_sibling->schema->nodetype == LYS_LEAF;
                                msg_sibling = msg_sibling->next) {
                            assert(msg_sibling->next);
                        }
                        if (msg_sibling->schema->nodetype & (LYS_ACTION | LYS_NOTIF)) {
                            /* we are done */
                            assert(act_notif->parent);
                            assert(act_notif->parent->schema == data_tree_parent->schema);
                            assert(msg_sibling == act_notif);
                            break;
                        }
                    }
                }

                /* loop ended after the first iteration, set the values correctly */
                if (!data_tree_parent) {
                    data_tree_sibling = (struct lyd_node *)data_tree;
                }

            } else {
                /* easy case */
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
            }

            /* unlink msg_sibling if needed (won't do anything otherwise) */
            lyd_unlink_internal(msg_sibling, 0);

            /* now we can insert msg_sibling into data_tree_parent or next to data_tree_sibling */
            assert(data_tree_parent || data_tree_sibling);
            if (data_tree_parent) {
                if (lyd_insert_common(data_tree_parent, NULL, msg_sibling, 0)) {
                    goto unlink_datatree;
                }
            } else {
                assert(!data_tree_sibling->parent);
                if (lyd_insert_nextto(data_tree_sibling->prev, msg_sibling, 0, 0)) {
                    goto unlink_datatree;
                }
            }
        }

        if (resolve_unres_data(ctx, unres, root, options)) {
            goto unlink_datatree;
        }

        /* we are done */
        ret = EXIT_SUCCESS;

        /* check that the operation/notification tree was not removed */
        if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
            set = NULL;
            if (data_tree) {
                set = lyd_find_instance(data_tree_parent ? data_tree_parent : data_tree_sibling, msg_op);
                assert(set && ((set->number == 0) || (set->number == 1)));
            } else if (*root) {
                set = lyd_find_instance(*root, msg_op);
                assert(set && ((set->number == 0) || (set->number == 1)));
            }
            if (!set || !set->number) {
                /* it was removed, handle specially */
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYS, msg_op, "Operation/notification not supported because of the current configuration.");
                ret = EXIT_FAILURE;
            }
            ly_set_free(set);
        }

unlink_datatree:
        /* put the trees back in order */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* unlink and insert it back, if there is a parent  */
            lyd_unlink_internal(msg_sibling, 0);
            if (msg_parent) {
                lyd_insert_common(msg_parent, NULL, msg_sibling, 0);
            }
        }
    } else {
        /* we are done */
        ret = EXIT_SUCCESS;
    }

    return ret;
}